

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::handleWheelEvent(QWidgetWindow *this,QWheelEvent *event)

{
  bool bVar1;
  byte bVar2;
  MouseButtons MVar3;
  KeyboardModifiers KVar4;
  ScrollPhase SVar5;
  MouseEventSource MVar6;
  QPoint QVar7;
  QPoint QVar8;
  QPointingDevice *pQVar9;
  QEvent *in_RSI;
  long in_FS_OFFSET;
  QWidget *widget;
  QWidget *rootWidget;
  QWheelEvent translated;
  QPointF mapped;
  QWidget *activePopupWidget;
  QPointF pos;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  Type in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  QPointF *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  QWidget *local_e0;
  QWidget *local_d8;
  QPointF local_c0;
  QWheelEvent local_b0 [96];
  QPointF local_50;
  QPointF local_40;
  QPointF local_30;
  QWidget *local_20;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QApplicationPrivate::instance();
  bVar1 = QApplicationPrivate::modalState();
  if (bVar1) {
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b5af4);
    QEvent::type(in_RSI);
    bVar1 = qt_try_modal((QWidget *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         in_stack_fffffffffffffec4);
    if (!bVar1) goto LAB_003b5dbc;
  }
  local_d8 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b5b26);
  local_18.yp = -NAN;
  local_18.xp = -NAN;
  local_18 = QSinglePointEvent::position((QSinglePointEvent *)0x3b5b53);
  local_20 = QApplication::activePopupWidget();
  if ((local_20 != (QWidget *)0x0) &&
     (bVar1 = ::operator!=((QWidget **)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                           ,(QPointer<QWidget> *)
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)), bVar1))
  {
    local_d8 = local_20;
    local_40 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x3b5bbe);
    local_30 = QWidget::mapFromGlobal
                         ((QWidget *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8);
    local_18 = local_30;
  }
  local_e0 = QWidget::childAt((QWidget *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (QPointF *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (local_e0 == (QWidget *)0x0) {
    local_e0 = local_d8;
  }
  local_50.yp = -NAN;
  local_50.xp = -NAN;
  local_50 = QWidget::mapFrom((QWidget *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                              (QWidget *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              in_stack_fffffffffffffed8);
  memset(local_b0,0xaa,0x60);
  local_c0 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x3b5ca5);
  QVar7 = QWheelEvent::pixelDelta
                    ((QWheelEvent *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  QVar8 = QWheelEvent::angleDelta
                    ((QWheelEvent *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  MVar3 = QSinglePointEvent::buttons
                    ((QSinglePointEvent *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  KVar4 = QInputEvent::modifiers
                    ((QInputEvent *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  SVar5 = QWheelEvent::phase((QWheelEvent *)in_RSI);
  bVar2 = QWheelEvent::inverted((QWheelEvent *)in_RSI);
  MVar6 = QWheelEvent::source((QWheelEvent *)in_RSI);
  pQVar9 = (QPointingDevice *)QPointerEvent::pointingDevice();
  QWheelEvent::QWheelEvent
            (local_b0,(QPointF *)&local_50,(QPointF *)&local_c0,(QPoint *)QVar7,(QPoint *)QVar8,
             (QFlags_conflict1 *)
             (ulong)(uint)MVar3.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                          super_QFlagsStorage<Qt::MouseButton>.i,
             (QFlags_conflict1 *)
             CONCAT44(in_stack_fffffffffffffebc,
                      KVar4.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                      super_QFlagsStorage<Qt::KeyboardModifier>.i),SVar5,(bool)(bVar2 & 1),MVar6,
             pQVar9);
  QInputEvent::timestamp((QInputEvent *)in_RSI);
  QPointerEvent::setTimestamp((ulonglong)local_b0);
  QCoreApplication::forwardEvent(&local_e0->super_QObject,(QEvent *)local_b0,in_RSI);
  QWheelEvent::~QWheelEvent(local_b0);
LAB_003b5dbc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleWheelEvent(QWheelEvent *event)
{
    if (QApplicationPrivate::instance()->modalState() && !qt_try_modal(m_widget, event->type()))
        return;

    QWidget *rootWidget = m_widget;
    QPointF pos = event->position();

    // Use proper popup window for wheel event. Some QPA sends the wheel
    // event to the root menu, so redirect it to the proper popup window.
    QWidget *activePopupWidget = QApplication::activePopupWidget();
    if (activePopupWidget && activePopupWidget != m_widget) {
        rootWidget = activePopupWidget;
        pos = rootWidget->mapFromGlobal(event->globalPosition());
    }

    // which child should have it?
    QWidget *widget = rootWidget->childAt(pos);

    if (!widget)
        widget = rootWidget;

    QPointF mapped = widget->mapFrom(rootWidget, pos);

    QWheelEvent translated(mapped, event->globalPosition(), event->pixelDelta(), event->angleDelta(),
                           event->buttons(), event->modifiers(), event->phase(), event->inverted(),
                           event->source(), event->pointingDevice());
    translated.setTimestamp(event->timestamp());
    QGuiApplication::forwardEvent(widget, &translated, event);
}